

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int argc_local;
  path local_60;
  string local_38;
  
  argc_local = argc;
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [5])"data",auto_format);
  std::filesystem::create_directory(&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [11])"data/3DGen",auto_format);
  std::filesystem::create_directory(&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  if (argc == 1) {
    UI::interactive_mode();
  }
  else {
    UI::argument_mode(&argc_local,argv);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Katana Exited.",(allocator<char> *)&local_60);
  UI::print_ln(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    //create data folder if doesn't exist
    std::filesystem::create_directory("data");
    std::filesystem::create_directory("data/3DGen");
    if (argc==1)
    {
        UI::interactive_mode();
    }
    else
    {
        UI::argument_mode(argc, argv);
    }
    UI::print_ln("Katana Exited.");
    return 0;
}